

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

SockAddr * unix_sock_addr(char *path)

{
  uint uVar1;
  SockAddr *__s;
  int n;
  SockAddr *ret;
  char *path_local;
  
  __s = (SockAddr *)safemalloc(1,0x220,0);
  memset(__s,0,0x220);
  __s->superfamily = UNIX;
  uVar1 = snprintf(__s->hostname,0x200,"%s",path);
  if ((int)uVar1 < 0) {
    __s->error = "snprintf failed";
  }
  else if ((0x1ff < uVar1) || (0x6b < uVar1)) {
    __s->error = "socket pathname too long";
  }
  __s->ais = (addrinfo *)0x0;
  __s->refcount = 1;
  return __s;
}

Assistant:

SockAddr *unix_sock_addr(const char *path)
{
    SockAddr *ret = snew(SockAddr);
    int n;

    memset(ret, 0, sizeof *ret);
    ret->superfamily = UNIX;
    n = snprintf(ret->hostname, sizeof ret->hostname, "%s", path);

    if (n < 0)
        ret->error = "snprintf failed";
    else if (n >= sizeof ret->hostname ||
             n >= sizeof(((struct sockaddr_un *)0)->sun_path))
        ret->error = "socket pathname too long";

#ifndef NO_IPV6
    ret->ais = NULL;
#else
    ret->addresses = NULL;
    ret->naddresses = 0;
#endif
    ret->refcount = 1;
    return ret;
}